

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O0

string<char> * __thiscall irr::core::string<char>::operator=(string<char> *this,string<char> *other)

{
  s32 sVar1;
  char *pcVar2;
  int local_2c;
  char *pcStack_28;
  s32 i;
  char *p;
  string<char> *other_local;
  string<char> *this_local;
  
  if (this != other) {
    if (this->array != (char *)0x0) {
      operator_delete__(this->array);
    }
    sVar1 = size(other);
    this->used = sVar1 + 1;
    this->allocated = sVar1 + 1;
    pcVar2 = (char *)operator_new__((long)this->used);
    this->array = pcVar2;
    pcStack_28 = c_str(other);
    for (local_2c = 0; local_2c < this->used; local_2c = local_2c + 1) {
      this->array[local_2c] = *pcStack_28;
      pcStack_28 = pcStack_28 + 1;
    }
  }
  return this;
}

Assistant:

string<T>& operator=(const string<T>& other) 
	{
		if (this == &other)
			return *this;

		delete [] array;
		allocated = used = other.size()+1;
		array = new T[used];

		const T* p = other.c_str();
		for (s32 i=0; i<used; ++i, ++p)
			array[i] = *p;

		return *this;
	}